

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::AppendTarget
          (cmExtraKateGenerator *this,cmGeneratedFileStream *fout,string *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,string *make,string *makeArgs,string *path,string *homeOutputDir)

{
  bool bVar1;
  cmGeneratedFileStream *pcVar2;
  undefined1 uVar3;
  ostream *poVar4;
  long *plVar5;
  string *psVar6;
  ulong *puVar7;
  long *plVar8;
  pointer pbVar9;
  ulong uVar10;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  cmExtraKateGenerator *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  pointer local_50;
  string *local_48;
  string *local_40;
  cmGeneratedFileStream *local_38;
  
  pbVar9 = (configs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (configs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = configs;
  local_b8 = this;
  local_48 = makeArgs;
  local_40 = make;
  local_38 = fout;
  if (pbVar9 != local_50) {
    do {
      pcVar2 = local_38;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_38,"\t\t\t",3);
      uVar3 = 0x20;
      if (AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
          ::JsonSep != '\0') {
        uVar3 = 0x2c;
      }
      local_100 = (ulong *)CONCAT71(local_100._1_7_,uVar3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)pcVar2,(char *)&local_100,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\"name\":\"",9);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(target->_M_dataplus)._M_p,target->_M_string_length);
      uVar10 = (long)(local_c0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_c0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      if (uVar10 < 0x21) {
        local_100 = &local_f0;
        local_f8 = 0;
        local_f0 = local_f0 & 0xffffffffffffff00;
      }
      else {
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,":","");
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_70,(ulong)(pbVar9->_M_dataplus)._M_p);
        local_100 = &local_f0;
        puVar7 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar7) {
          local_f0 = *puVar7;
          lStack_e8 = plVar5[3];
        }
        else {
          local_f0 = *puVar7;
          local_100 = (ulong *)*plVar5;
        }
        local_f8 = plVar5[1];
        *plVar5 = (long)puVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_100,local_f8)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", \"build_cmd\":\"",0x10);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_40->_M_dataplus)._M_p,local_40->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," -C \\\"",6);
      psVar6 = path;
      if (local_b8->UseNinja != false) {
        psVar6 = homeOutputDir;
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\\" ",3);
      if ((local_b8->UseNinja == true) &&
         (0x20 < (ulong)((long)(local_c0->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_c0->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start))) {
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90," -f build-","");
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_90,(ulong)(pbVar9->_M_dataplus)._M_p);
        local_b0 = &local_a0;
        plVar8 = plVar5 + 2;
        if ((long *)*plVar5 == plVar8) {
          local_a0 = *plVar8;
          lStack_98 = plVar5[3];
        }
        else {
          local_a0 = *plVar8;
          local_b0 = (long *)*plVar5;
        }
        local_a8 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_e0 = &local_d0;
        puVar7 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar7) {
          local_d0 = *puVar7;
          lStack_c8 = plVar5[3];
        }
        else {
          local_d0 = *puVar7;
          local_e0 = (ulong *)*plVar5;
        }
        local_d8 = plVar5[1];
        *plVar5 = (long)puVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        bVar1 = true;
      }
      else {
        local_e0 = &local_d0;
        local_d8 = 0;
        local_d0 = local_d0 & 0xffffffffffffff00;
        bVar1 = false;
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_e0,local_d8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(local_48->_M_dataplus)._M_p,local_48->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(target->_M_dataplus)._M_p,target->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"}\n",3);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (bVar1) {
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if ((0x20 < uVar10) && (local_70[0] != local_60)) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      AppendTarget(cmGeneratedFileStream&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
      ::JsonSep = '\x01';
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_50);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& target,
  const std::vector<std::string>& configs, const std::string& make,
  const std::string& makeArgs, const std::string& path,
  const std::string& homeOutputDir) const
{
  static char JsonSep = ' ';

  for (const std::string& conf : configs) {
    fout << "\t\t\t" << JsonSep << R"({"name":")" << target
         << ((configs.size() > 1) ? (std::string(":") + conf) : std::string())
         << "\", "
            "\"build_cmd\":\""
         << make << " -C \\\"" << (this->UseNinja ? homeOutputDir : path)
         << "\\\" "
         << ((this->UseNinja && configs.size() > 1)
               ? std::string(" -f build-") + conf + ".ninja"
               : std::string())
         << makeArgs << " " << target << "\"}\n";

    JsonSep = ',';
  }
}